

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

bool __thiscall
duckdb::Value::TryCastAs
          (Value *this,CastFunctionSet *set,GetCastFunctionInput *get_input,LogicalType *target_type
          ,bool strict)

{
  bool bVar1;
  string error_message;
  LogicalType local_88;
  Value new_value;
  
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value(&new_value,&local_88);
  LogicalType::~LogicalType(&local_88);
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  error_message._M_string_length = 0;
  error_message.field_2._M_local_buf[0] = '\0';
  bVar1 = TryCastAs(this,set,get_input,target_type,&new_value,&error_message,strict);
  if (bVar1) {
    LogicalType::operator=(&this->type_,target_type);
    this->is_null = new_value.is_null;
    (this->value_).bigint = new_value.value_.bigint;
    (this->value_).hugeint.upper = new_value.value_.hugeint.upper;
    shared_ptr<duckdb::ExtraValueInfo,_true>::operator=(&this->value_info_,&new_value.value_info_);
  }
  ::std::__cxx11::string::~string((string *)&error_message);
  ~Value(&new_value);
  return bVar1;
}

Assistant:

bool Value::TryCastAs(CastFunctionSet &set, GetCastFunctionInput &get_input, const LogicalType &target_type,
                      bool strict) {
	Value new_value;
	string error_message;
	if (!TryCastAs(set, get_input, target_type, new_value, &error_message, strict)) {
		return false;
	}
	type_ = target_type;
	is_null = new_value.is_null;
	value_ = new_value.value_;
	value_info_ = std::move(new_value.value_info_);
	return true;
}